

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

bool __thiscall cmCTestGIT::DiffParser::ProcessLine(DiffParser *this)

{
  Change *__x;
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  DiffFieldType DVar4;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  if (*(this->super_LineParser).Line._M_dataplus._M_p == ':') {
    this->DiffField = DiffFieldChange;
    local_50[0] = '?';
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    local_48._M_p = (pointer)&local_38;
    cmCTestGlobalVC::Change::operator=(&this->CurChange,(Change *)local_50);
    std::__cxx11::string::~string((string *)&local_48);
  }
  DVar4 = this->DiffField;
  if (DVar4 == DiffFieldDst) {
LAB_002fa03e:
    std::__cxx11::string::_M_assign((string *)&(this->CurChange).Path);
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
              (&this->Changes,&this->CurChange);
    DVar4 = DiffFieldNone;
  }
  else {
    if (DVar4 != DiffFieldSrc) {
      if (DVar4 != DiffFieldChange) {
        return true;
      }
      pcVar2 = (this->super_LineParser).Line._M_dataplus._M_p;
      DVar4 = DiffFieldNone;
      if (*pcVar2 == ':') {
        pcVar2 = ConsumeField(this,pcVar2 + 1);
        pcVar2 = ConsumeSpace(this,pcVar2);
        pcVar2 = ConsumeField(this,pcVar2);
        pcVar2 = ConsumeSpace(this,pcVar2);
        pcVar2 = ConsumeField(this,pcVar2);
        pcVar2 = ConsumeSpace(this,pcVar2);
        pcVar2 = ConsumeField(this,pcVar2);
        pcVar2 = ConsumeSpace(this,pcVar2);
        pcVar3 = ConsumeField(this,pcVar2);
        if (pcVar2 != pcVar3) {
          (this->CurChange).Action = *pcVar2;
          DVar4 = DiffFieldSrc;
        }
      }
      goto LAB_002fa09f;
    }
    __x = &this->CurChange;
    cVar1 = (this->CurChange).Action;
    if (cVar1 == 'R') {
      (this->CurChange).Action = 'D';
      std::__cxx11::string::_M_assign((string *)&(this->CurChange).Path);
      std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
                (&this->Changes,__x);
      local_50[0] = 'A';
      local_40 = 0;
      local_38._M_local_buf[0] = '\0';
      local_48._M_p = (pointer)&local_38;
      cmCTestGlobalVC::Change::operator=(__x,(Change *)local_50);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      if (cVar1 != 'C') goto LAB_002fa03e;
      __x->Action = 'A';
    }
    DVar4 = DiffFieldDst;
  }
LAB_002fa09f:
  this->DiffField = DVar4;
  return true;
}

Assistant:

virtual bool ProcessLine()
    {
    if(this->Line[0] == ':')
      {
      this->DiffField = DiffFieldChange;
      this->CurChange = Change();
      }
    if(this->DiffField == DiffFieldChange)
      {
      // :src-mode dst-mode src-sha1 dst-sha1 status
      if(this->Line[0] != ':')
        {
        this->DiffField = DiffFieldNone;
        return true;
        }
      const char* src_mode_first = this->Line.c_str()+1;
      const char* src_mode_last  = this->ConsumeField(src_mode_first);
      const char* dst_mode_first = this->ConsumeSpace(src_mode_last);
      const char* dst_mode_last  = this->ConsumeField(dst_mode_first);
      const char* src_sha1_first = this->ConsumeSpace(dst_mode_last);
      const char* src_sha1_last  = this->ConsumeField(src_sha1_first);
      const char* dst_sha1_first = this->ConsumeSpace(src_sha1_last);
      const char* dst_sha1_last  = this->ConsumeField(dst_sha1_first);
      const char* status_first   = this->ConsumeSpace(dst_sha1_last);
      const char* status_last    = this->ConsumeField(status_first);
      if(status_first != status_last)
        {
        this->CurChange.Action = *status_first;
        this->DiffField = DiffFieldSrc;
        }
      else
        {
        this->DiffField = DiffFieldNone;
        }
      }
    else if(this->DiffField == DiffFieldSrc)
      {
      // src-path
      if(this->CurChange.Action == 'C')
        {
        // Convert copy to addition of destination.
        this->CurChange.Action = 'A';
        this->DiffField = DiffFieldDst;
        }
      else if(this->CurChange.Action == 'R')
        {
        // Convert rename to deletion of source and addition of destination.
        this->CurChange.Action = 'D';
        this->CurChange.Path = this->Line;
        this->Changes.push_back(this->CurChange);

        this->CurChange = Change('A');
        this->DiffField = DiffFieldDst;
        }
      else
        {
        this->CurChange.Path = this->Line;
        this->Changes.push_back(this->CurChange);
        this->DiffField = this->DiffFieldNone;
        }
      }
    else if(this->DiffField == DiffFieldDst)
      {
      // dst-path
      this->CurChange.Path = this->Line;
      this->Changes.push_back(this->CurChange);
      this->DiffField = this->DiffFieldNone;
      }
    return true;
    }